

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie_test.cpp
# Opt level: O0

int trie_iterator_cb_clear(trie t,trie_key key,trie_value value,trie_cb_iterate_args args)

{
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RSI == (void *)0x0)) || (in_RDX == (void *)0x0)) {
    local_4 = 1;
  }
  else {
    free(in_RSI);
    free(in_RDX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int trie_iterator_cb_clear(trie t, trie_key key, trie_value value, trie_cb_iterate_args args)
{
	(void)args;

	if (t != NULL && key != NULL && value != NULL)
	{
		free(key);

		free(value);

		return 0;
	}

	return 1;
}